

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>::
prepare_fragment_shader
          (string *__return_storage_ptr__,
          InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type,string *function_definition,string *function_use,
          string *verification)

{
  TestError *this_00;
  string *verification_local;
  string *function_use_local;
  string *function_definition_local;
  TestShaderType tested_shader_type_local;
  InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  string *fragment_shader_source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"out vec4 colour;\n\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)function_definition)
    ;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)shader_start_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)function_use);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)verification);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"    colour = vec4(result);\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)shader_end_abi_cxx11_);
    break;
  case VERTEX_SHADER_TYPE:
  case GEOMETRY_SHADER_TYPE:
  case TESSELATION_CONTROL_SHADER_TYPE:
  case TESSELATION_EVALUATION_SHADER_TYPE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "in float fs_result;\n\nout vec4 colour;\n\nvoid main()\n{\n    colour =  vec4(fs_result);\n}\n\n"
              );
    break;
  case COMPUTE_SHADER_TYPE:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader object type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1320);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InteractionFunctionCalls1<API>::prepare_fragment_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& function_definition,
	const std::string& function_use, const std::string& verification)
{
	std::string fragment_shader_source;

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		break;

	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		fragment_shader_source = "out vec4 colour;\n\n";

		/* User-defined function definition. */
		fragment_shader_source += function_definition;
		fragment_shader_source += "\n\n";

		/* Main function definition. */
		fragment_shader_source += shader_start;
		fragment_shader_source += function_use;
		fragment_shader_source += "\n\n";
		fragment_shader_source += verification;
		fragment_shader_source += "\n\n";
		fragment_shader_source += "    colour = vec4(result);\n";
		fragment_shader_source += shader_end;
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		fragment_shader_source = "in float fs_result;\n\n"
								 "out vec4 colour;\n\n"
								 "void main()\n"
								 "{\n"
								 "    colour =  vec4(fs_result);\n"
								 "}\n"
								 "\n";
		break;

	default:
		TCU_FAIL("Unrecognized shader object type.");
		break;
	}

	return fragment_shader_source;
}